

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O2

void encode_mv_component(aom_writer *w,int comp,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  byte bVar1;
  aom_cdf_prob (*cdf) [5];
  int i;
  ulong uVar2;
  aom_cdf_prob *cdf_00;
  int iVar3;
  aom_cdf_prob (*cdf_01) [3];
  uint symb;
  int offset;
  
  iVar3 = -comp;
  if (0 < comp) {
    iVar3 = comp;
  }
  bVar1 = av1_get_mv_class(iVar3 + -1,&offset);
  symb = offset >> 3;
  aom_write_symbol(w,(uint)comp >> 0x1f,mvcomp->sign_cdf,2);
  aom_write_symbol(w,(uint)bVar1,mvcomp->classes_cdf,0xb);
  if (bVar1 == 0) {
    aom_write_symbol(w,symb,mvcomp->class0_cdf,2);
  }
  else {
    cdf_01 = mvcomp->bits_cdf;
    for (uVar2 = 0; bVar1 != uVar2; uVar2 = uVar2 + 1) {
      aom_write_symbol(w,(uint)((symb >> ((uint)uVar2 & 0x1f) & 1) != 0),*cdf_01,2);
      cdf_01 = cdf_01 + 1;
    }
  }
  if (-1 < precision) {
    cdf = mvcomp->class0_fp_cdf + (int)symb;
    if (bVar1 != 0) {
      cdf = &mvcomp->fp_cdf;
    }
    aom_write_symbol(w,(uint)offset >> 1 & 3,*cdf,4);
    if (precision != '\0') {
      cdf_00 = mvcomp->class0_hp_cdf;
      if (bVar1 != 0) {
        cdf_00 = mvcomp->hp_cdf;
      }
      aom_write_symbol(w,offset & 1,cdf_00,2);
    }
  }
  return;
}

Assistant:

static void encode_mv_component(aom_writer *w, int comp, nmv_component *mvcomp,
                                MvSubpelPrecision precision) {
  assert(comp != 0);
  int offset;
  const int sign = comp < 0;
  const int mag = sign ? -comp : comp;
  const int mv_class = av1_get_mv_class(mag - 1, &offset);
  const int d = offset >> 3;         // int mv data
  const int fr = (offset >> 1) & 3;  // fractional mv data
  const int hp = offset & 1;         // high precision mv data

  // Sign
  aom_write_symbol(w, sign, mvcomp->sign_cdf, 2);

  // Class
  aom_write_symbol(w, mv_class, mvcomp->classes_cdf, MV_CLASSES);

  // Integer bits
  if (mv_class == MV_CLASS_0) {
    aom_write_symbol(w, d, mvcomp->class0_cdf, CLASS0_SIZE);
  } else {
    int i;
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    for (i = 0; i < n; ++i)
      aom_write_symbol(w, (d >> i) & 1, mvcomp->bits_cdf[i], 2);
  }
  // Fractional bits
  if (precision > MV_SUBPEL_NONE) {
    aom_write_symbol(
        w, fr,
        mv_class == MV_CLASS_0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf,
        MV_FP_SIZE);
  }

  // High precision bit
  if (precision > MV_SUBPEL_LOW_PRECISION)
    aom_write_symbol(
        w, hp, mv_class == MV_CLASS_0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf,
        2);
}